

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cc
# Opt level: O2

ts_nsec get_monotonic_ts(void)

{
  int iVar1;
  timespec tm;
  
  iVar1 = clock_gettime(1,(timespec *)&tm);
  if (iVar1 != -1) {
    return tm.tv_nsec;
  }
  abort();
}

Assistant:

ts_nsec get_monotonic_ts() {
    ts_nsec ts = 0;
#if defined(WIN32)
    /* GetTickCound64 gives us near 60years of ticks...*/
    ts =  GetTickCount64() * 1000;  // TODO: this is not true high-res microseconds on windows
#elif defined(__APPLE__)
    long time = mach_absolute_time();

    static mach_timebase_info_data_t timebase;
    if (timebase.denom == 0) {
      mach_timebase_info(&timebase);
    }

    ts = (double)time * timebase.numer / timebase.denom;
#elif defined(__linux__) || defined(__sun) || defined(__FreeBSD__)
    /* Linux and Solaris can use clock_gettime */
    struct timespec tm;
    if (clock_gettime(CLOCK_MONOTONIC, &tm) == -1) {
        abort();
    }
    ts = tm.tv_nsec;
#else
#error "Don't know how to build get_monotonic_ts"
#endif

    return ts;
}